

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

bool cli::createPath(string *path)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  char cVar4;
  ulong uVar5;
  string part;
  
  cVar4 = (char)path;
  lVar1 = std::__cxx11::string::rfind(cVar4,0x2f);
  uVar5 = std::__cxx11::string::find(cVar4,0x2f);
  do {
    if (lVar1 + 1U <= uVar5) {
LAB_001057ca:
      return lVar1 + 1U <= uVar5;
    }
    std::__cxx11::string::substr((ulong)&part,(ulong)path);
    bVar2 = isDirectory(&part);
    if (!bVar2) {
      iVar3 = mkdir(part._M_dataplus._M_p,0x1ed);
      if (iVar3 != 0) {
        std::__cxx11::string::~string((string *)&part);
        goto LAB_001057ca;
      }
    }
    std::__cxx11::string::~string((string *)&part);
    uVar5 = std::__cxx11::string::find(cVar4,0x2f);
  } while( true );
}

Assistant:

bool createPath(const std::string &path)
	{
		std::string::size_type end = path.find_last_of('/')+1;
		for (std::string::size_type index = path.find_first_of('/', 0); index < end; index = path.find_first_of('/', index+1))
		{
			std::string part = path.substr(0, index);
			if (!isDirectory(part))
			{
#ifdef _WIN32
				if (CreateDirectoryA(part.c_str(), nullptr) == 0)
					return false;
#else
				if (mkdir(part.c_str(), S_IRWXU | S_IRGRP | S_IXGRP | S_IROTH | S_IXOTH) != 0)
					return false;
#endif
			}
		}

		return true;
	}